

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTabBar::child(QAccessibleTabBar *this,int index)

{
  Data<QHashPrivate::Node<int,_unsigned_int>_> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Node<int,_unsigned_int> *pNVar4;
  QAccessibleInterface *pQVar5;
  QTabBar *pQVar6;
  QObject *pQVar7;
  undefined8 uVar8;
  long lVar9;
  long in_FS_OFFSET;
  int copy;
  uint local_34;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_childInterfaces).d;
  local_30 = index;
  if (((this_00 != (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0) &&
      (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::findNode<int>
                          (this_00,&local_30), pNVar4 != (Node<int,_unsigned_int> *)0x0)) &&
     (pNVar4->value != 0)) {
    pQVar5 = (QAccessibleInterface *)QAccessible::accessibleInterface(pNVar4->value);
    goto LAB_00515083;
  }
  iVar3 = local_30;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
  iVar2 = QTabBar::count(pQVar6);
  iVar1 = local_30;
  if (iVar3 < iVar2) {
    pQVar5 = (QAccessibleInterface *)operator_new(0x28);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar7 = (QObject *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar3 = local_30;
    *(undefined ***)pQVar5 = &PTR__QAccessibleTabButton_00806ad0;
    *(undefined ***)(pQVar5 + 8) = &PTR__QAccessibleTabButton_00806ba0;
    if (pQVar7 == (QObject *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
    }
    *(undefined8 *)(pQVar5 + 0x10) = uVar8;
    *(QObject **)(pQVar5 + 0x18) = pQVar7;
    *(int *)(pQVar5 + 0x20) = iVar3;
    QAccessible::registerAccessibleInterface(pQVar5);
    local_34 = QAccessible::uniqueId(pQVar5);
    local_2c = local_30;
    QHash<int,unsigned_int>::emplace<unsigned_int_const&>
              ((QHash<int,unsigned_int> *)&this->m_childInterfaces,&local_2c,&local_34);
    goto LAB_00515083;
  }
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
  iVar2 = QTabBar::count(pQVar6);
  iVar3 = local_30;
  if (iVar1 < iVar2) {
LAB_00514f97:
    pQVar5 = (QAccessibleInterface *)0x0;
  }
  else {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar2 = QTabBar::count(pQVar6);
    iVar1 = local_30;
    if (iVar3 == iVar2) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar9 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      pQVar7 = *(QObject **)(*(long *)(lVar9 + 8) + 0x290);
    }
    else {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar3 = QTabBar::count(pQVar6);
      if (iVar1 - iVar3 != 1) goto LAB_00514f97;
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar9 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      pQVar7 = *(QObject **)(*(long *)(lVar9 + 8) + 0x288);
    }
    pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar7);
  }
LAB_00515083:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

QAccessibleInterface* QAccessibleTabBar::child(int index) const
{
    if (QAccessible::Id id = m_childInterfaces.value(index))
        return QAccessible::accessibleInterface(id);

    // first the tabs, then 2 buttons
    if (index < tabBar()->count()) {
        QAccessibleTabButton *button = new QAccessibleTabButton(tabBar(), index);
        QAccessible::registerAccessibleInterface(button);
        m_childInterfaces.insert(index, QAccessible::uniqueId(button));
        return button;
    } else if (index >= tabBar()->count()) {
        // left button
        if (index - tabBar()->count() == 0) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->leftB);
        }
        // right button
        if (index - tabBar()->count() == 1) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->rightB);
        }
    }
    return nullptr;
}